

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

int __thiscall
Graph<unsigned_long,_scc::VectorType>::connect
          (Graph<unsigned_long,_scc::VectorType> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  size_type __n;
  size_type __n_00;
  int extraout_EAX;
  reference pvVar1;
  undefined4 in_register_00000034;
  reference local_30;
  reference local_28;
  sockaddr *local_20;
  unsigned_long *y_local;
  unsigned_long *x_local;
  Graph<unsigned_long,_scc::VectorType> *this_local;
  
  y_local = (unsigned_long *)CONCAT44(in_register_00000034,__fd);
  local_20 = __addr;
  x_local = (unsigned_long *)this;
  pvVar1 = std::
           vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ::operator[](&this->nodes,*y_local);
  __n._0_2_ = local_20->sa_family;
  __n._2_1_ = local_20->sa_data[0];
  __n._3_1_ = local_20->sa_data[1];
  __n._4_1_ = local_20->sa_data[2];
  __n._5_1_ = local_20->sa_data[3];
  __n._6_1_ = local_20->sa_data[4];
  __n._7_1_ = local_20->sa_data[5];
  local_28 = std::
             vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             ::operator[](&this->nodes,__n);
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::push_back(&pvVar1->edges,&local_28);
  __n_00._0_2_ = local_20->sa_family;
  __n_00._2_1_ = local_20->sa_data[0];
  __n_00._3_1_ = local_20->sa_data[1];
  __n_00._4_1_ = local_20->sa_data[2];
  __n_00._5_1_ = local_20->sa_data[3];
  __n_00._6_1_ = local_20->sa_data[4];
  __n_00._7_1_ = local_20->sa_data[5];
  pvVar1 = std::
           vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ::operator[](&this->nodes,__n_00);
  local_30 = std::
             vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             ::operator[](&this->nodes,*y_local);
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::push_back(&pvVar1->dual_edges,&local_30);
  return extraout_EAX;
}

Assistant:

void connect(const Index &x, const Index &y) {
        nodes[x].edges.push_back(&nodes[y]);
        nodes[y].dual_edges.push_back(&nodes[x]);
    }